

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_ExpressionFail_x_iutest_x_Comparison_Test::Body
          (iu_ExpressionFail_x_iutest_x_Comparison_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_f60;
  Fixed local_f30;
  anon_class_1_0_00000001 local_da1;
  undefined1 local_da0 [8];
  AssertionResult iutest_spi_ar_7;
  Fixed local_d48;
  anon_class_1_0_00000001 local_bb9;
  undefined1 local_bb8 [8];
  AssertionResult iutest_spi_ar_6;
  Fixed local_b60;
  anon_class_1_0_00000001 local_9d1;
  undefined1 local_9d0 [8];
  AssertionResult iutest_spi_ar_5;
  Fixed local_978;
  anon_class_1_0_00000001 local_7e9;
  undefined1 local_7e8 [8];
  AssertionResult iutest_spi_ar_4;
  Fixed local_790;
  anon_class_1_0_00000001 local_601;
  undefined1 local_600 [8];
  AssertionResult iutest_spi_ar_3;
  Fixed local_5a8;
  anon_class_1_0_00000001 local_419;
  undefined1 local_418 [8];
  AssertionResult iutest_spi_ar_2;
  Fixed local_3c0;
  anon_class_1_0_00000001 local_231;
  undefined1 local_230 [8];
  AssertionResult iutest_spi_ar_1;
  Fixed local_1d8;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_spi_ar;
  iu_ExpressionFail_x_iutest_x_Comparison_Test *this_local;
  
  iutest_spi_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x98,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_230,&local_231);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x99,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_2.m_result,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_418,&local_419);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    memset(&local_5a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_3.m_result,&local_5a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_600,&local_601);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    memset(&local_790,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_790);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_600);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_4.m_result,&local_790);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_790);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_7e8,&local_7e9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    memset(&local_978,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_978);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7e8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_5.m_result,&local_978);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_978);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_9d0,&local_9d1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar1) {
    memset(&local_b60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b60);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9d0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_6.m_result,&local_b60);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b60);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_bb8,&local_bb9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    memset(&local_d48,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d48);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bb8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_7.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_7.m_result,&local_d48);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d48);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_da0,&local_da1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    memset(&local_f30,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_f30);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_da0);
    iutest::AssertionHelper::AssertionHelper
              (&local_f60,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x9f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_f60,&local_f30);
    iutest::AssertionHelper::~AssertionHelper(&local_f60);
    iutest::AssertionHelper::Fixed::~Fixed(&local_f30);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  return;
}

Assistant:

IUTEST(ExpressionFail, Comparison)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() == 41), "expansion: 42 == 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() != 42), "expansion: 42 != 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <  41), "expansion: 42 < 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <= 41), "expansion: 42 <= 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >  43), "expansion: 42 > 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >= 43), "expansion: 42 >= 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() &&  0), "expansion: false && 0");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() ||  0), "expansion: false || 0");
}